

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteBuiltin_db_get_schema(jx9_context *pCtx,int argc,jx9_value **argv)

{
  unqlite_col *puVar1;
  int local_54;
  undefined1 auStack_50 [4];
  int nByte;
  SyString sName;
  unqlite_vm *pVm;
  char *zName;
  unqlite_col *pCol;
  jx9_value **argv_local;
  int argc_local;
  jx9_context *pCtx_local;
  
  if (argc < 1) {
    jx9_context_throw_error(pCtx,1,"Missing collection name and/or db scheme");
    jx9_result_bool(pCtx,0);
  }
  else {
    _auStack_50 = jx9_value_to_string(*argv,&local_54);
    if (local_54 < 1) {
      jx9_context_throw_error(pCtx,1,"Invalid collection name");
      jx9_result_bool(pCtx,0);
    }
    else {
      sName.zString._0_4_ = local_54;
      sName._8_8_ = jx9_context_user_data(pCtx);
      puVar1 = unqliteCollectionFetch((unqlite_vm *)sName._8_8_,(SyString *)auStack_50,4);
      if (puVar1 == (unqlite_col *)0x0) {
        jx9_context_throw_error_format(pCtx,2,"No such collection \'%z\'",auStack_50);
        jx9_result_null(pCtx);
      }
      else {
        jx9_result_value(pCtx,&puVar1->sSchema);
      }
    }
  }
  return 0;
}

Assistant:

static int unqliteBuiltin_db_get_schema(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or db scheme");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		/* Return the collection schema */
		jx9_result_value(pCtx,&pCol->sSchema);
	}else{
		jx9_context_throw_error_format(pCtx,JX9_CTX_WARNING,
			"No such collection '%z'",
			&sName
			);
		jx9_result_null(pCtx);
	}
	return JX9_OK;
}